

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-matchers.h
# Opt level: O0

bool __thiscall
testing::internal::
UnorderedElementsAreMatcherImpl<const_phmap::node_hash_map<phmap::priv::(anonymous_namespace)::NonMovableKey,_int,_phmap::priv::(anonymous_namespace)::NonMovableKeyHash,_phmap::priv::(anonymous_namespace)::NonMovableKeyEq,_std::allocator<std::pair<const_phmap::priv::(anonymous_namespace)::NonMovableKey,_int>_>_>_&>
::MatchAndExplain(UnorderedElementsAreMatcherImpl<const_phmap::node_hash_map<phmap::priv::(anonymous_namespace)::NonMovableKey,_int,_phmap::priv::(anonymous_namespace)::NonMovableKeyHash,_phmap::priv::(anonymous_namespace)::NonMovableKeyEq,_std::allocator<std::pair<const_phmap::priv::(anonymous_namespace)::NonMovableKey,_int>_>_>_&>
                  *this,node_hash_map<phmap::priv::(anonymous_namespace)::NonMovableKey,_int,_phmap::priv::(anonymous_namespace)::NonMovableKeyHash,_phmap::priv::(anonymous_namespace)::NonMovableKeyEq,_std::allocator<std::pair<const_phmap::priv::(anonymous_namespace)::NonMovableKey,_int>_>_>
                        *container,MatchResultListener *listener)

{
  bool bVar1;
  raw_hash_set<phmap::priv::NodeHashMapPolicy<phmap::priv::(anonymous_namespace)::NonMovableKey,_int>,_phmap::priv::(anonymous_namespace)::NonMovableKeyHash,_phmap::priv::(anonymous_namespace)::NonMovableKeyEq,_std::allocator<std::pair<const_phmap::priv::(anonymous_namespace)::NonMovableKey,_int>_>_>
  *this_00;
  const_iterator elem_first;
  const_iterator elem_last;
  bool local_c2;
  undefined1 local_68 [8];
  MatchMatrix matrix;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  element_printouts;
  StlContainerReference stl_container;
  MatchResultListener *listener_local;
  node_hash_map<phmap::priv::(anonymous_namespace)::NonMovableKey,_int,_phmap::priv::(anonymous_namespace)::NonMovableKeyHash,_phmap::priv::(anonymous_namespace)::NonMovableKeyEq,_std::allocator<std::pair<const_phmap::priv::(anonymous_namespace)::NonMovableKey,_int>_>_>
  *container_local;
  UnorderedElementsAreMatcherImpl<const_phmap::node_hash_map<phmap::priv::(anonymous_namespace)::NonMovableKey,_int,_phmap::priv::(anonymous_namespace)::NonMovableKeyHash,_phmap::priv::(anonymous_namespace)::NonMovableKeyEq,_std::allocator<std::pair<const_phmap::priv::(anonymous_namespace)::NonMovableKey,_int>_>_>_&>
  *this_local;
  
  this_00 = (raw_hash_set<phmap::priv::NodeHashMapPolicy<phmap::priv::(anonymous_namespace)::NonMovableKey,_int>,_phmap::priv::(anonymous_namespace)::NonMovableKeyHash,_phmap::priv::(anonymous_namespace)::NonMovableKeyEq,_std::allocator<std::pair<const_phmap::priv::(anonymous_namespace)::NonMovableKey,_int>_>_>
             *)StlContainerView<phmap::node_hash_map<phmap::priv::(anonymous_namespace)::NonMovableKey,_int,_phmap::priv::(anonymous_namespace)::NonMovableKeyHash,_phmap::priv::(anonymous_namespace)::NonMovableKeyEq,_std::allocator<std::pair<const_phmap::priv::(anonymous_namespace)::NonMovableKey,_int>_>_>_>
               ::ConstReference(container);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&matrix.matched_.super__Vector_base<char,_std::allocator<char>_>._M_impl.field_0x10);
  elem_first = phmap::priv::
               raw_hash_set<phmap::priv::NodeHashMapPolicy<phmap::priv::(anonymous_namespace)::NonMovableKey,_int>,_phmap::priv::(anonymous_namespace)::NonMovableKeyHash,_phmap::priv::(anonymous_namespace)::NonMovableKeyEq,_std::allocator<std::pair<const_phmap::priv::(anonymous_namespace)::NonMovableKey,_int>_>_>
               ::begin(this_00);
  elem_last = phmap::priv::
              raw_hash_set<phmap::priv::NodeHashMapPolicy<phmap::priv::(anonymous_namespace)::NonMovableKey,_int>,_phmap::priv::(anonymous_namespace)::NonMovableKeyHash,_phmap::priv::(anonymous_namespace)::NonMovableKeyEq,_std::allocator<std::pair<const_phmap::priv::(anonymous_namespace)::NonMovableKey,_int>_>_>
              ::end(this_00);
  UnorderedElementsAreMatcherImpl<phmap::node_hash_map<phmap::priv::(anonymous_namespace)::NonMovableKey,int,phmap::priv::(anonymous_namespace)::NonMovableKeyHash,phmap::priv::(anonymous_namespace)::NonMovableKeyEq,std::allocator<std::pair<phmap::priv::(anonymous_namespace)::NonMovableKey_const,int>>>const&>
  ::
  AnalyzeElements<phmap::priv::raw_hash_set<phmap::priv::NodeHashMapPolicy<phmap::priv::(anonymous_namespace)::NonMovableKey,int>,phmap::priv::(anonymous_namespace)::NonMovableKeyHash,phmap::priv::(anonymous_namespace)::NonMovableKeyEq,std::allocator<std::pair<phmap::priv::(anonymous_namespace)::NonMovableKey_const,int>>>::const_iterator>
            ((MatchMatrix *)local_68,
             (UnorderedElementsAreMatcherImpl<phmap::node_hash_map<phmap::priv::(anonymous_namespace)::NonMovableKey,int,phmap::priv::(anonymous_namespace)::NonMovableKeyHash,phmap::priv::(anonymous_namespace)::NonMovableKeyEq,std::allocator<std::pair<phmap::priv::(anonymous_namespace)::NonMovableKey_const,int>>>const&>
              *)this,elem_first,elem_last,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&matrix.matched_.super__Vector_base<char,_std::allocator<char>_>._M_impl.field_0x10,
             listener);
  bVar1 = UnorderedElementsAreMatcherImplBase::VerifyMatchMatrix
                    (&this->super_UnorderedElementsAreMatcherImplBase,
                     (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)&matrix.matched_.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                         field_0x10,(MatchMatrix *)local_68,listener);
  local_c2 = false;
  if (bVar1) {
    local_c2 = UnorderedElementsAreMatcherImplBase::FindPairing
                         (&this->super_UnorderedElementsAreMatcherImplBase,(MatchMatrix *)local_68,
                          listener);
  }
  MatchMatrix::~MatchMatrix((MatchMatrix *)local_68);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&matrix.matched_.super__Vector_base<char,_std::allocator<char>_>._M_impl.field_0x10);
  return local_c2;
}

Assistant:

bool MatchAndExplain(Container container,
                       MatchResultListener* listener) const override {
    StlContainerReference stl_container = View::ConstReference(container);
    ::std::vector<std::string> element_printouts;
    MatchMatrix matrix =
        AnalyzeElements(stl_container.begin(), stl_container.end(),
                        &element_printouts, listener);

    return VerifyMatchMatrix(element_printouts, matrix, listener) &&
           FindPairing(matrix, listener);
  }